

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

Bac_ObjType_t Bac_NameToType(char *pName)

{
  char *__s;
  long lVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  Bac_ObjType_t BVar4;
  
  iVar2 = strncmp(pName,"ABC_",4);
  BVar4 = BAC_OBJ_NONE;
  if (iVar2 == 0) {
    lVar1 = 0x20;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x18 == 0x6f8) {
        return BAC_OBJ_NONE;
      }
      __s = *(char **)((long)&s_Types[0].Type + lVar3);
      __n = strlen(__s);
      iVar2 = strncmp(pName + 4,__s,__n);
      lVar1 = lVar3 + 0x18;
    } while (iVar2 != 0);
    BVar4 = *(Bac_ObjType_t *)((long)&s_Types[10].pName + lVar3);
  }
  return BVar4;
}

Assistant:

Bac_ObjType_t Bac_NameToType( char * pName )
{
    int i;
    if ( strncmp(pName, s_Pref, strlen(s_Pref)) )
        return BAC_OBJ_NONE;
    pName += strlen(s_Pref);
    for ( i = 1; i < BAC_BOX_UNKNOWN; i++ )
        if ( !strncmp(pName, s_Types[i].pName, strlen(s_Types[i].pName)) )
            return s_Types[i].Type;
    return BAC_OBJ_NONE;
}